

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *samplings;
  double *pdVar1;
  _Rb_tree_node_base *p_Var2;
  bool *pbVar3;
  ostringstream *poVar4;
  ostream *poVar5;
  Precision PVar6;
  float fVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  Variable<tcu::Vector<float,_2>_> *pVVar12;
  pointer pcVar13;
  Variable<tcu::Vector<float,_3>_> *pVVar14;
  Variable<tcu::Matrix<float,_2,_3>_> *pVVar15;
  double dVar16;
  pointer pVVar17;
  bool bVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  _Rb_tree_node_base *p_Var22;
  long lVar23;
  IVal *pIVar24;
  IVal *pIVar25;
  IVal *pIVar26;
  undefined8 *puVar27;
  Vector<float,_2> *val;
  Vector<float,_3> *val_00;
  undefined1 *puVar28;
  float afVar29 [2];
  float afVar30 [2];
  float afVar31 [2];
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  *pBVar32;
  double dVar33;
  TestStatus *pTVar34;
  byte bVar35;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  IVal reference0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  _Alloc_hider in_stack_fffffffffffffa98;
  float local_560;
  undefined4 uStack_55c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  *local_548;
  IVal local_539;
  undefined1 local_538 [12];
  uint uStack_52c;
  undefined1 auStack_528 [24];
  double dStack_510;
  TestLog *local_4f0;
  FloatFormat *local_4e8;
  size_t local_4e0;
  double local_4d8;
  TestStatus *local_4d0;
  string local_4c8;
  double local_4a8;
  double local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  double local_448;
  Precision PStack_440;
  undefined4 uStack_43c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_438;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>
  local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  bVar35 = 0;
  this_00 = this->m_samplings;
  samplings = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_4d0 = __return_storage_ptr__;
  iVar20 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4e8 = samplings;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)samplings,(FloatFormat *)(ulong)PVar6,(Precision)sVar8,(ulong)(iVar20 + 0xdeadbeef),
             (deUint32)SUB84(in_stack_fffffffffffffa98._M_p,0));
  pVVar17 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_4e0 = (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_2,_3>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_2e8,local_4e0);
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_4f0 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.
              super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_468 + 8);
  local_548 = this;
  local_468._0_8_ = local_4f0;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var2 = (_Rb_tree_node_base *)(local_538 + 8);
  stack0xfffffffffffffad0 = (double)((ulong)uStack_52c << 0x20);
  auStack_528._0_4_ = 0.0;
  auStack_528._4_4_ = 0.0;
  dStack_510 = 0.0;
  pSVar9 = (local_548->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  auStack_528._8_8_ = p_Var2;
  auStack_528._16_8_ = p_Var2;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_538);
  if ((_Rb_tree_node_base *)auStack_528._8_8_ != p_Var2) {
    p_Var22 = (_Rb_tree_node_base *)auStack_528._8_8_;
    do {
      (**(code **)(**(long **)(p_Var22 + 1) + 0x30))(*(long **)(p_Var22 + 1),local_1a8);
      p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
    } while (p_Var22 != p_Var2);
  }
  if (dStack_510 != 0.0) {
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_4f0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,in_stack_fffffffffffffa98._M_p,CONCAT44(uStack_55c,local_560));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffa98._M_p != &local_558) {
      operator_delete(in_stack_fffffffffffffa98._M_p,local_558._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_538);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar10 = (local_548->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_4e0,&local_218,&local_288,0);
  local_538._0_8_ = local_538._0_8_ & 0xffffffffffffff00;
  stack0xfffffffffffffad0 = INFINITY;
  auStack_528._0_4_ = 0.0;
  auStack_528._4_4_ = -NAN;
  auStack_528._8_8_ = auStack_528._8_8_ & 0xffffffffffffff00;
  auStack_528._16_8_ = (_Base_ptr)0x7ff0000000000000;
  dStack_510 = -INFINITY;
  lVar23 = 8;
  do {
    local_1a8[lVar23 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar23) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar23 + 8) = 0xfff0000000000000;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x50);
  lVar23 = 8;
  do {
    local_1a8[lVar23 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar23) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar23 + 8) = 0xfff0000000000000;
    lVar23 = lVar23 + 0x18;
  } while (lVar23 != 0x50);
  tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_468);
  pBVar32 = local_548;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_498,
             (local_548->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_538);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_498,
             (pBVar32->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar32->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa98);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar32->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<tcu::Matrix<float,2,3>>
            ((Environment *)&local_498,
             (pBVar32->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.m_ptr,
             (IVal *)local_468);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (pBVar32->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_539);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar17) {
LAB_0095985a:
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_4f0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    pTVar34 = local_4d0;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
    local_468._0_8_ = (IVal *)local_458;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Pass","");
    pTVar34->m_code = QP_TEST_RESULT_PASS;
    (pTVar34->m_description)._M_dataplus._M_p = (pointer)&(pTVar34->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar34->m_description,local_468._0_8_,
               (pointer)(local_468._0_8_ + CONCAT44(local_468._12_4_,local_468._8_4_)));
    if ((IVal *)local_468._0_8_ == (IVal *)local_458) goto LAB_00959a44;
    afVar29[1] = (float)local_458._4_4_;
    afVar29[0] = (float)local_458._0_4_;
    pIVar26 = (IVal *)local_468._0_8_;
  }
  else {
    local_4a8 = (double)(local_4e0 + (local_4e0 == 0));
    dVar33 = 0.0;
    local_4d8 = 0.0;
    pBVar32 = local_548;
    do {
      tcu::Matrix<tcu::Interval,_2,_3>::Matrix((Matrix<tcu::Interval,_2,_3> *)local_1a8);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_538,local_4e8,(Vector<float,_2> *)&stack0xfffffffffffffa98);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_468,local_4e8,(IVal *)local_538);
      pIVar24 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_498,
                           (pBVar32->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar24->m_data[1].m_lo = local_448;
      pIVar24->m_data[1].m_hi = (double)CONCAT44(uStack_43c,PStack_440);
      pIVar24->m_data[0].m_hi = (double)CONCAT44(local_458._4_4_,local_458._0_4_);
      *(ulong *)(pIVar24->m_data + 1) = CONCAT44(local_458._12_4_,local_458._8_4_);
      *(undefined8 *)pIVar24->m_data = local_468._0_8_;
      pIVar24->m_data[0].m_lo = (double)CONCAT44(local_468._12_4_,local_468._8_4_);
      fVar7 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start[(long)dVar33].m_data[2];
      paVar11 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)local_278.in1.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar33].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_538,local_4e8,(Vector<float,_3> *)&stack0xfffffffffffffa98);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_468,local_4e8,(IVal *)local_538);
      pIVar25 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_498,
                           (pBVar32->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      puVar27 = (undefined8 *)local_468;
      for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
        *(undefined8 *)pIVar25->m_data = *puVar27;
        puVar27 = puVar27 + (ulong)bVar35 * -2 + 1;
        pIVar25 = (IVal *)((long)pIVar25 + ((ulong)bVar35 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar32->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar32->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      PStack_440 = (pBVar32->m_caseCtx).precision;
      local_448 = local_4e8->m_maxValue;
      local_468._0_8_ = *(undefined8 *)local_4e8;
      local_468._8_4_ = local_4e8->m_fractionBits;
      local_468._12_4_ = local_4e8->m_hasSubnormal;
      local_458._0_4_ = local_4e8->m_hasInf;
      local_458._4_4_ = local_4e8->m_hasNaN;
      local_458[8] = local_4e8->m_exactPrecision;
      local_458._9_3_ = *(undefined3 *)&local_4e8->field_0x19;
      local_458._12_4_ = *(undefined4 *)&local_4e8->field_0x1c;
      local_430 = 0;
      pSVar9 = (pBVar32->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_438 = &local_498;
      (*pSVar9->_vptr_Statement[3])(pSVar9,local_468);
      pIVar26 = Environment::lookup<tcu::Matrix<float,2,3>>
                          ((Environment *)&local_498,
                           (pBVar32->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doConvert
                ((IVal *)local_468,&local_2b8,pIVar26);
      puVar28 = local_1a8;
      pIVar26 = (IVal *)local_468;
      bVar19 = true;
      do {
        bVar18 = bVar19;
        lVar23 = 0;
        do {
          *(undefined8 *)(puVar28 + lVar23 + 0x10) =
               *(undefined8 *)((long)&(pIVar26->m_data).m_data[0].m_data[0].m_hi + lVar23);
          pbVar3 = &(pIVar26->m_data).m_data[0].m_data[0].m_hasNaN + lVar23;
          dVar16 = *(double *)(pbVar3 + 8);
          *(undefined8 *)(puVar28 + lVar23) = *(undefined8 *)pbVar3;
          *(double *)((long)(puVar28 + lVar23) + 8) = dVar16;
          lVar23 = lVar23 + 0x30;
        } while (lVar23 != 0x90);
        puVar28 = local_1a8 + 0x18;
        pIVar26 = (IVal *)(local_458 + 8);
        bVar19 = false;
      } while (bVar18);
      local_4a0 = (double)((long)dVar33 * 0x18);
      bVar19 = contains<tcu::Matrix<float,2,3>>
                         ((IVal *)local_1a8,
                          local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)dVar33);
      local_468._0_8_ = local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar19 = tcu::ResultCollector::check(&local_1f8,bVar19,(string *)local_468);
      if ((TestLog *)local_468._0_8_ != (TestLog *)local_458) {
        operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,local_458._0_4_) + 1);
      }
      pBVar32 = local_548;
      if ((!bVar19) &&
         (uVar21 = SUB84(local_4d8,0) + 1, local_4d8 = (double)(ulong)uVar21, (int)uVar21 < 0x65)) {
        local_468._0_8_ = local_4f0;
        poVar4 = (ostringstream *)(local_468 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar12 = (pBVar32->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        val = (Vector<float,_2> *)auStack_528;
        pcVar13 = (pVVar12->m_name)._M_dataplus._M_p;
        local_538._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar13,pcVar13 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_538._0_8_,(long)stack0xfffffffffffffad0)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)&stack0xfffffffffffffa98,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)dVar33),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),paVar11->_M_local_buf,CONCAT44(uStack_55c,fVar7));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if (paVar11 != &local_558) {
          operator_delete(paVar11,local_558._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_538._0_8_ != (Vector<float,_2> *)auStack_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(auStack_528._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar14 = (pBVar32->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                  m_ptr;
        val_00 = (Vector<float,_3> *)auStack_528;
        pcVar13 = (pVVar14->m_name)._M_dataplus._M_p;
        local_538._0_8_ = val_00;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar13,pcVar13 + (pVVar14->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_538._0_8_,(long)stack0xfffffffffffffad0)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)&stack0xfffffffffffffa98,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   (local_278.in1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)dVar33),val_00);
        poVar5 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,paVar11->_M_local_buf,CONCAT44(uStack_55c,fVar7));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if (paVar11 != &local_558) {
          operator_delete(paVar11,local_558._M_allocated_capacity + 1);
        }
        if ((Vector<float,_3> *)local_538._0_8_ != (Vector<float,_3> *)auStack_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(auStack_528._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
        pVVar15 = (pBVar32->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_2,_3>_>_>.
                  m_ptr;
        pIVar26 = (IVal *)auStack_528;
        pcVar13 = (pVVar15->m_name)._M_dataplus._M_p;
        local_538._0_8_ = pIVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar13,pcVar13 + (pVVar15->m_name)._M_string_length);
        poVar5 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(char *)local_538._0_8_,(long)stack0xfffffffffffffad0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
        valueToString<tcu::Matrix<float,2,3>>
                  ((string *)&stack0xfffffffffffffa98,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   ((long)((local_2e8.out0.
                            super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   (long)local_4a0),(Matrix<float,_2,_3> *)pIVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,paVar11->_M_local_buf,CONCAT44(uStack_55c,fVar7));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,3>>
                  (&local_4c8,(shaderexecutor *)&local_2b8,(FloatFormat *)local_1a8,pIVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_4c8._M_dataplus._M_p,local_4c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
        if (paVar11 != &local_558) {
          operator_delete(paVar11,local_558._M_allocated_capacity + 1);
        }
        if ((IVal *)local_538._0_8_ != (IVal *)auStack_528) {
          operator_delete((void *)local_538._0_8_,(ulong)(auStack_528._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
        std::ios_base::~ios_base(local_3f0);
      }
      dVar33 = (double)((long)dVar33 + 1);
    } while (dVar33 != local_4a8);
    iVar20 = SUB84(local_4d8,0);
    if (iVar20 < 0x65) {
      if (iVar20 == 0) goto LAB_0095985a;
    }
    else {
      poVar4 = (ostringstream *)(local_468 + 8);
      local_468._0_8_ = local_4f0;
      std::__cxx11::ostringstream::ostringstream(poVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
      std::ostream::operator<<(poVar4,iVar20 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar4);
      std::ios_base::~ios_base(local_3f0);
    }
    poVar4 = (ostringstream *)(local_468 + 8);
    local_468._0_8_ = local_4f0;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
    std::ostream::operator<<(local_468,iVar20);
    pTVar34 = local_4d0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
    std::ios_base::~ios_base(local_3f8);
    local_468._0_8_ = local_458;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468," test failed. Check log for the details","");
    afVar29 = (float  [2])
              (CONCAT44(local_468._12_4_,local_468._8_4_) + (long)stack0xfffffffffffffad0);
    afVar30[0] = 2.10195e-44;
    afVar30[1] = 0.0;
    if ((IVal *)local_538._0_8_ != (IVal *)auStack_528) {
      afVar30 = (float  [2])auStack_528._0_8_;
    }
    if ((ulong)afVar30 < (ulong)afVar29) {
      afVar31[0] = 2.10195e-44;
      afVar31[1] = 0.0;
      if ((IVal *)local_468._0_8_ != (IVal *)local_458) {
        afVar31[1] = (float)local_458._4_4_;
        afVar31[0] = (float)local_458._0_4_;
      }
      if ((ulong)afVar31 < (ulong)afVar29) goto LAB_0095984b;
      puVar27 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_468,0,(char *)0x0,local_538._0_8_);
    }
    else {
LAB_0095984b:
      puVar27 = (undefined8 *)std::__cxx11::string::_M_append(local_538,local_468._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar27 + 2);
    if ((double *)*puVar27 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar27 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar27 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar27;
    }
    local_1a8._8_8_ = puVar27[1];
    *puVar27 = pdVar1;
    puVar27[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar34->m_code = QP_TEST_RESULT_FAIL;
    (pTVar34->m_description)._M_dataplus._M_p = (pointer)&(pTVar34->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar34->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((IVal *)local_468._0_8_ != (IVal *)local_458) {
      operator_delete((void *)local_468._0_8_,CONCAT44(local_458._4_4_,local_458._0_4_) + 1);
    }
    afVar29 = (float  [2])auStack_528._0_8_;
    pIVar26 = (IVal *)local_538._0_8_;
    if ((IVal *)local_538._0_8_ == (IVal *)auStack_528) goto LAB_00959a44;
  }
  operator_delete(pIVar26,(ulong)((long)afVar29 + 1));
LAB_00959a44:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.
      super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar34;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}